

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_lv_base.h
# Opt level: O1

value_type __thiscall
sc_dt::sc_proxy<sc_dt::sc_lv_base>::nand_reduce(sc_proxy<sc_dt::sc_lv_base> *this)

{
  uint uVar1;
  sc_lv_base *x;
  ulong uVar2;
  
  if ((int)*(uint *)&this[1]._vptr_sc_proxy < 1) {
    uVar2 = 1;
  }
  else {
    uVar2 = 1;
    uVar1 = 0;
    do {
      uVar2 = (ulong)*(uint *)(sc_logic::and_table +
                              (ulong)((uint)((*(uint *)((long)this[2]._vptr_sc_proxy +
                                                       (ulong)(uVar1 >> 5) * 4) >> (uVar1 & 0x1f) &
                                             1) != 0) +
                                     (*(uint *)((long)this[3]._vptr_sc_proxy +
                                               (ulong)(uVar1 >> 5) * 4) >> ((byte)uVar1 & 0x1f) & 1)
                                     * 2) * 4 + uVar2 * 0x10);
      uVar1 = uVar1 + 1;
    } while (*(uint *)&this[1]._vptr_sc_proxy != uVar1);
  }
  return (&sc_logic::not_table)[uVar2];
}

Assistant:

int length() const
	{ return m_len; }